

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageSorters.h
# Opt level: O0

int FIX::header_order::getOrderedPosition(int field)

{
  undefined4 local_c;
  int field_local;
  
  if (field == 8) {
    local_c = 1;
  }
  else if (field == 9) {
    local_c = 2;
  }
  else if (field == 0x23) {
    local_c = 3;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

static int getOrderedPosition( const int field )
  {
    switch ( field )
    {
      case FIELD::BeginString: return 1;
      case FIELD::BodyLength: return 2;
      case FIELD::MsgType: return 3;
      default: return 0;
    };
  }